

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

int __thiscall Settings::processArguments(Settings *this,int argc,char **argv)

{
  int iVar1;
  exception *e;
  int retval;
  char **in_stack_00000908;
  int in_stack_00000914;
  Settings *in_stack_00000918;
  
  iVar1 = processArgs(in_stack_00000918,in_stack_00000914,in_stack_00000908);
  return iVar1;
}

Assistant:

int Settings::processArguments(int argc, char *argv[])
{
    int retval = 0;
    try
    {
        retval = processArgs(argc, argv);
    }
    catch (std::exception &e) // command-line argument errors
    {
        std::cout << "ERROR : " << e.what() << std::endl;
        displayHelp();
        retval = 1;
    }
    return retval;
}